

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static-var-tests.cpp
# Opt level: O0

void StaticVarTest(bool *result)

{
  StaticVarsTestClass *pSVar1;
  ulong local_48;
  uint64_t staticMemSize;
  size_t staticMemCount;
  StaticVarsTestClass *local_28;
  StaticVarsTestClass *var1;
  uint64_t memLeakSize;
  size_t memLeakCount;
  bool *result_local;
  
  memLeakCount = (size_t)result;
  MemPlumber::start(false,"",false);
  pSVar1 = (StaticVarsTestClass *)operator_new(0x10);
  StaticVarsTestClass::StaticVarsTestClass(pSVar1);
  local_28 = pSVar1;
  MemPlumber::staticMemCheck(&staticMemSize,&local_48,false,"",false);
  if (staticMemSize == 4) {
    if (local_48 == 0x20) {
      MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&var1,false,"",false);
      pSVar1 = local_28;
      if (memLeakSize == 2) {
        if (var1 == (StaticVarsTestClass *)0x18) {
          if (local_28 != (StaticVarsTestClass *)0x0) {
            StaticVarsTestClass::~StaticVarsTestClass(local_28);
            operator_delete(pSVar1,0x10);
          }
          MemPlumber::memLeakCheck(&memLeakSize,(uint64_t *)&var1,false,"",false);
          if (memLeakSize == 0) {
            if (var1 == (StaticVarsTestClass *)0x0) {
              MemPlumber::stopAndFreeAllMemory();
            }
            else {
              printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                     "StaticVarTest",0x49,(ulong)var1 & 0xffffffff,0);
              *(undefined1 *)memLeakCount = 0;
            }
          }
          else {
            printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                   "StaticVarTest",0x49,memLeakSize & 0xffffffff,0);
            *(undefined1 *)memLeakCount = 0;
          }
        }
        else {
          printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarTest",
                 0x45,(ulong)var1 & 0xffffffff,0x18);
          *(undefined1 *)memLeakCount = 0;
        }
      }
      else {
        printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarTest",
               0x45,memLeakSize & 0xffffffff,2);
        *(undefined1 *)memLeakCount = 0;
      }
    }
    else {
      printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarTest",0x43
             ,local_48 & 0xffffffff,0x20);
      *(undefined1 *)memLeakCount = 0;
    }
  }
  else {
    printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","StaticVarTest",0x42,
           staticMemSize & 0xffffffff,4);
    *(undefined1 *)memLeakCount = 0;
  }
  return;
}

Assistant:

TEST_CASE(StaticVarTest) {

    START_TEST;

    StaticVarsTestClass* var1 = new StaticVarsTestClass();

    size_t staticMemCount;
    uint64_t staticMemSize;
    MemPlumber::staticMemCheck(staticMemCount, staticMemSize);
    TEST_ASSERT_EQUAL(staticMemCount, 4);
    TEST_ASSERT_EQUAL(staticMemSize, sizeof(StaticClass) + sizeof(int) + sizeof(StaticVarsTestClass) + sizeof(uint64_t));

    CHECK_MEM_LEAK(2, sizeof(StaticVarsTestClass) + sizeof(uint64_t));

    delete var1;

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}